

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O3

uint tinf_adler32(void *data,uint length)

{
  uint uVar1;
  uchar *buf;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar12;
  
  if (length != 0) {
    uVar10 = 1;
    uVar1 = 0;
    do {
      uVar2 = 0x15b0;
      if (length < 0x15b0) {
        uVar2 = (ulong)length;
      }
      if (0xf < length) {
        uVar12 = uVar2 >> 4;
        do {
          iVar13 = *data + uVar10;
          iVar3 = (uint)*(byte *)((long)data + 1) + iVar13;
          iVar14 = (uint)*(byte *)((long)data + 2) + iVar3;
          iVar4 = (uint)*(byte *)((long)data + 3) + iVar14;
          iVar15 = (uint)*(byte *)((long)data + 4) + iVar4;
          iVar5 = (uint)*(byte *)((long)data + 5) + iVar15;
          iVar16 = (uint)*(byte *)((long)data + 6) + iVar5;
          iVar6 = (uint)*(byte *)((long)data + 7) + iVar16;
          iVar17 = (uint)*(byte *)((long)data + 8) + iVar6;
          iVar7 = (uint)*(byte *)((long)data + 9) + iVar17;
          iVar18 = (uint)*(byte *)((long)data + 10) + iVar7;
          iVar8 = (uint)*(byte *)((long)data + 0xb) + iVar18;
          iVar19 = (uint)*(byte *)((long)data + 0xc) + iVar8;
          iVar9 = (uint)*(byte *)((long)data + 0xd) + iVar19;
          iVar20 = (uint)*(byte *)((long)data + 0xe) + iVar9;
          uVar10 = (uint)*(byte *)((long)data + 0xf) + iVar20;
          uVar1 = uVar1 + iVar13 + iVar3 + iVar14 + iVar4 + iVar15 + iVar5 + iVar16 + iVar6 + iVar17
                  + iVar7 + iVar18 + iVar8 + iVar19 + iVar9 + iVar20 + uVar10;
          data = (void *)((long)data + 0x10);
          uVar11 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar11;
        } while (uVar11 != 0);
      }
      uVar11 = (uint)uVar2 & 0xf;
      if ((uVar2 & 0xf) != 0) {
        lVar21 = 0;
        do {
          uVar10 = uVar10 + *(byte *)((long)data + lVar21);
          uVar1 = uVar1 + uVar10;
          lVar21 = lVar21 + 1;
        } while (uVar11 != (uint)lVar21);
        data = (void *)((long)data + (ulong)uVar11);
      }
      uVar10 = uVar10 % 0xfff1;
      uVar1 = uVar1 % 0xfff1;
      length = length - (uint)uVar2;
    } while (length != 0);
    return uVar1 * 0x10000 | uVar10;
  }
  return 1;
}

Assistant:

unsigned int tinf_adler32(const void *data, unsigned int length)
{
	const unsigned char *buf = (const unsigned char *) data;

	unsigned int s1 = 1;
	unsigned int s2 = 0;

	while (length > 0) {
		int k = length < A32_NMAX ? length : A32_NMAX;
		int i;

		for (i = k / 16; i; --i, buf += 16) {
			s1 += buf[0];
			s2 += s1;
			s1 += buf[1];
			s2 += s1;
			s1 += buf[2];
			s2 += s1;
			s1 += buf[3];
			s2 += s1;
			s1 += buf[4];
			s2 += s1;
			s1 += buf[5];
			s2 += s1;
			s1 += buf[6];
			s2 += s1;
			s1 += buf[7];
			s2 += s1;

			s1 += buf[8];
			s2 += s1;
			s1 += buf[9];
			s2 += s1;
			s1 += buf[10];
			s2 += s1;
			s1 += buf[11];
			s2 += s1;
			s1 += buf[12];
			s2 += s1;
			s1 += buf[13];
			s2 += s1;
			s1 += buf[14];
			s2 += s1;
			s1 += buf[15];
			s2 += s1;
		}

		for (i = k % 16; i; --i) {
			s1 += *buf++;
			s2 += s1;
		}

		s1 %= A32_BASE;
		s2 %= A32_BASE;

		length -= k;
	}

	return (s2 << 16) | s1;
}